

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O1

void des3_set3key(uint32_t *esk,uint32_t *dsk,uchar *key)

{
  ulong uVar1;
  long lVar2;
  
  mbedtls_des_setkey(esk,key);
  mbedtls_des_setkey(dsk + 0x20,key + 8);
  mbedtls_des_setkey(esk + 0x40,key + 0x10);
  uVar1 = 0xfffffffffffffffe;
  lVar2 = 0x3e;
  do {
    dsk[uVar1 + 2] = esk[lVar2 + 0x20];
    dsk[uVar1 + 3] = esk[lVar2 + 0x21];
    esk[uVar1 + 0x22] = dsk[lVar2];
    esk[uVar1 + 0x23] = dsk[lVar2 + 1];
    dsk[uVar1 + 0x42] = esk[lVar2 + -0x20];
    dsk[uVar1 + 0x43] = esk[lVar2 + -0x1f];
    uVar1 = uVar1 + 2;
    lVar2 = lVar2 + -2;
  } while (uVar1 < 0x1e);
  return;
}

Assistant:

static void des3_set3key( uint32_t esk[96],
                          uint32_t dsk[96],
                          const unsigned char key[24] )
{
    int i;

    mbedtls_des_setkey( esk, key );
    mbedtls_des_setkey( dsk + 32, key +  8 );
    mbedtls_des_setkey( esk + 64, key + 16 );

    for( i = 0; i < 32; i += 2 )
    {
        dsk[i     ] = esk[94 - i];
        dsk[i +  1] = esk[95 - i];

        esk[i + 32] = dsk[62 - i];
        esk[i + 33] = dsk[63 - i];

        dsk[i + 64] = esk[30 - i];
        dsk[i + 65] = esk[31 - i];
    }
}